

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_dump.cc
# Opt level: O0

void print_buf(fdb_kvs_handle *db,void *buf,size_t buflen,bool hex,int align)

{
  byte in_CL;
  ulong in_RDX;
  long in_RSI;
  int in_R8D;
  size_t j;
  size_t i;
  char local_32;
  ulong local_30;
  ulong local_28;
  
  if (in_RSI == 0) {
    printf("(null)\n");
  }
  else if ((in_CL & 1) == 0) {
    printf("%.*s\n",in_RDX & 0xffffffff,in_RSI);
  }
  else {
    printf("(hex)\n");
    for (local_28 = 0; local_28 < in_RDX; local_28 = (long)in_R8D + local_28) {
      printf("        ");
      for (local_30 = local_28; local_30 < local_28 + (long)in_R8D; local_30 = local_30 + 1) {
        if (local_30 < in_RDX) {
          printf("%02x ",(ulong)*(byte *)(in_RSI + local_30));
        }
        else {
          printf("   ");
        }
        if ((local_30 + 1 & 7) == 0) {
          printf(" ");
        }
      }
      printf(" ");
      for (local_30 = local_28; local_30 < local_28 + (long)in_R8D && local_30 < in_RDX;
          local_30 = local_30 + 1) {
        if ((*(char *)(in_RSI + local_30) < ' ') || ('}' < *(char *)(in_RSI + local_30))) {
          local_32 = '.';
        }
        else {
          local_32 = *(char *)(in_RSI + local_30);
        }
        printf("%c",(ulong)(uint)(int)local_32);
      }
      printf("\n");
    }
  }
  return;
}

Assistant:

INLINE void print_buf(fdb_kvs_handle *db, void *buf, size_t buflen, bool hex,
                      int align)
{
    if (buf) {
        if (!hex) {
            // plaintext
            printf("%.*s\n", (int)buflen, (char*)buf);
        } else {
            // hex dump
            size_t i, j;
            printf("(hex)\n");
            for (i=0;i<buflen;i+=align) {
                printf("        ");
                for (j=i; j<i+align; ++j){
                    if (j<buflen) {
                        printf("%02x ", ((uint8_t*)buf)[j]);
                    } else {
                        printf("   ");
                    }
                    if ((j+1)%8 == 0) {
                        printf(" ");
                    }
                }
                printf(" ");
                for (j=i; j<i+align && j<buflen; ++j){
                    // print only readable ascii character
                    printf("%c",
                     (0x20 <= ((char*)buf)[j] && ((char*)buf)[j] <= 0x7d)?
                               ((char*)buf)[j] : '.'  );
                }
                printf("\n");
            }
        }
    } else {
        printf("(null)\n");
    }
}